

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

string * __thiscall
punky::ast::CallExpression::to_string_abi_cxx11_
          (string *__return_storage_ptr__,CallExpression *this)

{
  ExprNode *pEVar1;
  vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>
  *pvVar2;
  pointer puVar3;
  unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>
  *puVar4;
  pointer puVar5;
  string args_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pEVar1 = (this->m_function)._M_t.
           super___uniq_ptr_impl<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>.
           _M_t.
           super__Tuple_impl<0UL,_punky::ast::ExprNode_*,_std::default_delete<punky::ast::ExprNode>_>
           .super__Head_base<0UL,_punky::ast::ExprNode_*,_false>._M_head_impl;
  if (pEVar1 != (ExprNode *)0x0) {
    (*(pEVar1->super_AstNode)._vptr_AstNode[3])(&local_70);
    ExprNode::token_literal_abi_cxx11_(&local_50,&this->super_ExprNode);
    std::operator+(&local_90,&local_70,&local_50);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if ((this->m_arguments).
        super__Optional_base<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>_>
        ._M_engaged == true) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      puVar4 = std::
               optional<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>_>
               ::value(&this->m_arguments);
      pvVar2 = (puVar4->_M_t).
               super___uniq_ptr_impl<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>
               .
               super__Head_base<0UL,_std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_*,_false>
               ._M_head_impl;
      puVar3 = (pvVar2->
               super__Vector_base<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (puVar5 = *(pointer *)
                     &(pvVar2->
                      super__Vector_base<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>
                      )._M_impl; puVar5 != puVar3; puVar5 = puVar5 + 1) {
        (**(code **)(*(long *)(puVar5->_M_t).
                              super___uniq_ptr_impl<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>
                    + 0x18))(&local_50);
        std::operator+(&local_70,&local_50,", ");
        std::__cxx11::string::append((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
      }
      if (2 < local_90._M_string_length) {
        std::__cxx11::string::pop_back();
        std::__cxx11::string::pop_back();
      }
      std::operator+(&local_70,&local_90,")");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
    }
    else {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CallExpression::to_string() const
{
    std::string call_str;
    if (m_function)
    {
        call_str.append(m_function->to_string() + token_literal());
        if (m_arguments.has_value())
        {
            std::string args_str;
            for (const auto& args : *m_arguments.value())
                args_str.append(args->to_string() + ", ");
            if (args_str.size() > 2)
            {
                args_str.pop_back();
                args_str.pop_back();
            }
            call_str.append(args_str + ")");
        }
        else
            call_str.append(")");
    }
    return call_str;
}